

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

string * Json::valueToString_abi_cxx11_(LargestInt value)

{
  allocator<char> *paVar1;
  LargestUInt in_RSI;
  string *in_RDI;
  char *current;
  UIntToStringBuffer buffer;
  allocator<char> local_41;
  allocator<char> *__a;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  allocator<char> aaStack_1f [31];
  
  __a = aaStack_1f;
  if (in_RSI == 0x8000000000000000) {
    uintToString(0x8000000000000000,(char **)&stack0xffffffffffffffc0);
    paVar1 = __a + -1;
    __a[-1] = (allocator<char>)0x2d;
    __a = paVar1;
  }
  else if ((long)in_RSI < 0) {
    uintToString(-in_RSI,(char **)&stack0xffffffffffffffc0);
    paVar1 = __a + -1;
    __a[-1] = (allocator<char>)0x2d;
    __a = paVar1;
  }
  else {
    uintToString(in_RSI,(char **)&stack0xffffffffffffffc0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,__a);
  std::allocator<char>::~allocator(&local_41);
  return in_RDI;
}

Assistant:

JSONCPP_STRING valueToString(LargestInt value) {
  UIntToStringBuffer buffer;
  char* current = buffer + sizeof(buffer);
  if (value == Value::minLargestInt) {
    uintToString(LargestUInt(Value::maxLargestInt) + 1, current);
    *--current = '-';
  } else if (value < 0) {
    uintToString(LargestUInt(-value), current);
    *--current = '-';
  } else {
    uintToString(LargestUInt(value), current);
  }
  assert(current >= buffer);
  return current;
}